

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void EmitDestructuredObject
               (ParseNode *lhs,RegSlot rhsLocationOrig,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo)

{
  OpCode OVar1;
  code *pcVar2;
  ByteCodeGenerator *pBVar3;
  bool bVar4;
  ByteCodeLabel labelID;
  RegSlot RVar5;
  BOOL BVar6;
  RegSlot destinationRegister;
  undefined4 *puVar7;
  ParseNodeObjLit *pPVar8;
  uint32 *buffer;
  ParseNodeBin *pPVar9;
  ParseNodePtr memberNodes;
  char *byteCodeGenerator_00;
  ParseNodePtr *ppPVar10;
  ParseNode *node;
  uint32 staticCount;
  uint32 *puVar11;
  ByteCodeWriter *pBVar12;
  ParseNodePtr local_78;
  ParseNode *local_70;
  ByteCodeWriter *local_68;
  uint local_5c;
  ByteCodeGenerator *local_58;
  uint32 local_50;
  RegSlot local_4c;
  uint32 index;
  undefined4 uStack_44;
  uint32 *local_40;
  bool local_32;
  bool local_31;
  bool hasComputedProps;
  
  _index = (FuncInfo *)CONCAT44(uStack_44,rhsLocationOrig);
  local_58 = byteCodeGenerator;
  if (lhs->nop != knopObjectPattern) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1bdf,"(lhs->nop == knopObjectPattern)","lhs->nop == knopObjectPattern");
    if (!bVar4) goto LAB_0080d566;
    *puVar7 = 0;
  }
  pPVar8 = ParseNode::AsParseNodeObjLit(lhs);
  pBVar3 = local_58;
  memberNodes = (pPVar8->super_ParseNodeUni).pnode1;
  local_40 = (uint32 *)(ulong)pPVar8->staticCount;
  local_5c = pPVar8->computedCount;
  local_31 = pPVar8->hasRest;
  local_32 = false;
  ByteCodeGenerator::StartStatement(local_58,lhs);
  pBVar12 = &pBVar3->m_writer;
  labelID = Js::ByteCodeWriter::DefineLabel(pBVar12);
  RVar5 = FuncInfo::AcquireTmpRegister(funcInfo);
  local_70 = lhs;
  Js::ByteCodeWriter::Reg2(pBVar12,Ld_A,RVar5,index);
  node = local_70;
  local_4c = RVar5;
  Js::ByteCodeWriter::BrReg2(pBVar12,BrNeq_A,labelID,RVar5,funcInfo->undefinedConstantRegister);
  Js::ByteCodeWriter::W1(pBVar12,RuntimeTypeError,0x1610);
  Js::ByteCodeWriter::MarkLabel(pBVar12,labelID);
  puVar11 = local_40;
  if (memberNodes != (ParseNodePtr)0x0) {
    destinationRegister = 0xffffffff;
    RVar5 = 0xffffffff;
    local_68 = pBVar12;
    _index = funcInfo;
    if (local_31 != false) {
      if ((0x3fffffff < (uint)local_40) || (0x3ffffffd < (uint)local_40)) {
        Math::DefaultOverflowPolicy();
      }
      byteCodeGenerator_00 = (char *)local_58->alloc;
      BVar6 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar4) goto LAB_0080d566;
        *puVar7 = 0;
        puVar11 = local_40;
      }
      local_40 = (uint32 *)
                 Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *
                               )byteCodeGenerator_00,(long)puVar11 * 4 + 8);
      if (local_40 == (uint32 *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        byteCodeGenerator_00 =
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
        ;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x20d,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar4) goto LAB_0080d566;
        *puVar7 = 0;
      }
      staticCount = (uint32)puVar11;
      *local_40 = staticCount;
      local_40[1] = 0;
      OVar1 = memberNodes->nop;
      buffer = local_40;
      if (((OVar1 != knopEllipsis) && (OVar1 != knopList)) && (OVar1 != knopObjectPatternMember)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        byteCodeGenerator_00 =
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
        ;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x1bfa,
                           "(pnode1->nop == knopList || pnode1->nop == knopObjectPatternMember || pnode1->nop == knopEllipsis)"
                           ,
                           "pnode1->nop == knopList || pnode1->nop == knopObjectPatternMember || pnode1->nop == knopEllipsis"
                          );
        if (!bVar4) {
LAB_0080d566:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
        buffer = local_40;
      }
      local_40 = (uint32 *)(ulong)((int)((long)puVar11 * 4) + 8);
      EmitObjectPropertyIdsToArray
                ((ByteCodeGenerator *)byteCodeGenerator_00,(PropertyId *)(buffer + 2),memberNodes,
                 staticCount,&local_32);
      destinationRegister = FuncInfo::AcquireTmpRegister(funcInfo);
      pBVar12 = local_68;
      Js::ByteCodeWriter::Auxiliary
                (local_68,LdPropIds,destinationRegister,buffer,(int)local_40,staticCount);
      RVar5 = destinationRegister;
      if (local_32 == true) {
        RVar5 = FuncInfo::AcquireTmpRegister(funcInfo);
        Js::ByteCodeWriter::Reg1Unsigned1(pBVar12,NewPropIdArrForCompProps,RVar5,local_5c);
      }
    }
    bVar4 = local_31;
    local_50 = 0;
    ppPVar10 = &local_78;
    local_78 = memberNodes;
    do {
      if (memberNodes->nop != knopList) {
        EmitDestructuredObjectMember
                  (memberNodes,local_4c,destinationRegister,RVar5,&local_50,bVar4,local_58,_index);
        break;
      }
      pPVar9 = ParseNode::AsParseNodeBin(memberNodes);
      EmitDestructuredObjectMember
                (pPVar9->pnode1,local_4c,destinationRegister,RVar5,&local_50,bVar4,local_58,_index);
      pPVar9 = ParseNode::AsParseNodeBin(*ppPVar10);
      memberNodes = pPVar9->pnode2;
      ppPVar10 = &pPVar9->pnode2;
    } while (memberNodes != (ParseNodePtr)0x0);
    node = local_70;
    funcInfo = _index;
    pBVar12 = local_68;
    if (local_31 != false) {
      if (local_32 == true) {
        FuncInfo::ReleaseTmpRegister(_index,RVar5);
      }
      FuncInfo::ReleaseTmpRegister(_index,destinationRegister);
      funcInfo = _index;
      pBVar12 = local_68;
    }
  }
  FuncInfo::ReleaseTmpRegister(funcInfo,local_4c);
  Js::ByteCodeWriter::EndStatement(pBVar12,node);
  return;
}

Assistant:

void EmitDestructuredObject(ParseNode *lhs,
    Js::RegSlot rhsLocationOrig,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo)
{
    Assert(lhs->nop == knopObjectPattern);
    ParseNodeObjLit *pnodeObjLit = lhs->AsParseNodeObjLit();
    ParseNodePtr pnode1 = pnodeObjLit->pnode1;
    uint32 staticCount = pnodeObjLit->staticCount;
    uint32 computedCount = pnodeObjLit->computedCount;
    bool hasRest = pnodeObjLit->hasRest;
    bool hasComputedProps = false;

    byteCodeGenerator->StartStatement(lhs);

    Js::ByteCodeLabel skipThrow = byteCodeGenerator->Writer()->DefineLabel();
    Js::RegSlot rhsLocation = funcInfo->AcquireTmpRegister();
    byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A, rhsLocation, rhsLocationOrig);
    byteCodeGenerator->Writer()->BrReg2(Js::OpCode::BrNeq_A, skipThrow, rhsLocation, funcInfo->undefinedConstantRegister);
    byteCodeGenerator->Writer()->W1(Js::OpCode::RuntimeTypeError, SCODE_CODE(JSERR_ObjectCoercible));
    byteCodeGenerator->Writer()->MarkLabel(skipThrow);

    if (pnode1 != nullptr)
    {
        Js::RegSlot propIdArrLocation = Js::Constants::NoRegister;
        Js::RegSlot computedPropIdArrLocation = Js::Constants::NoRegister;
        if (hasRest)
        {
            uint extraAlloc = UInt32Math::Mul(staticCount, sizeof(Js::PropertyId));
            uint auxSize = UInt32Math::Add(sizeof(Js::PropertyIdArray), extraAlloc);
            Js::PropertyIdArray *propIds = AnewPlus(byteCodeGenerator->GetAllocator(), extraAlloc, Js::PropertyIdArray, staticCount, 0);

            Assert(pnode1->nop == knopList || pnode1->nop == knopObjectPatternMember || pnode1->nop == knopEllipsis);

            EmitObjectPropertyIdsToArray(byteCodeGenerator, propIds->elements, pnode1, staticCount, &hasComputedProps);

            // Load static PropertyIdArray here
            propIdArrLocation = funcInfo->AcquireTmpRegister();
            byteCodeGenerator->Writer()->Auxiliary(Js::OpCode::LdPropIds, propIdArrLocation, propIds, auxSize, staticCount);

            if (hasComputedProps)
            {
                computedPropIdArrLocation = funcInfo->AcquireTmpRegister();
                byteCodeGenerator->Writer()->Reg1Unsigned1(Js::OpCode::NewPropIdArrForCompProps, computedPropIdArrLocation, computedCount);
            }
            else
            {
                computedPropIdArrLocation = propIdArrLocation;
            }
        }

        uint32 index = 0;
        Parser::ForEachItemInList(pnode1, [&](ParseNodePtr memberNode) {
            EmitDestructuredObjectMember(memberNode, rhsLocation, propIdArrLocation, computedPropIdArrLocation, 
                &index, hasRest, byteCodeGenerator, funcInfo);
        });

        if (hasRest)
        {
            if (hasComputedProps)
            {
                funcInfo->ReleaseTmpRegister(computedPropIdArrLocation);
            }
            funcInfo->ReleaseTmpRegister(propIdArrLocation);
        }
    }

    funcInfo->ReleaseTmpRegister(rhsLocation);
    
    byteCodeGenerator->EndStatement(lhs);
}